

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  Message *containing_type;
  CodedInputStream *pCVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  WireType WVar5;
  string *psVar6;
  char *pcVar7;
  UninterpretedOption *value_00;
  UnknownFieldSet *pUVar8;
  FileOptions_OptimizeMode local_168;
  uint32 local_164;
  int value;
  uint32 tag;
  CodedInputStream *input_local;
  FileOptions *this_local;
  CodedInputStream *local_148;
  uint32 local_140;
  uint local_13c;
  CodedInputStream *local_138;
  char local_12d;
  uint local_12c;
  CodedInputStream *local_128;
  char local_11d;
  uint local_11c;
  CodedInputStream *local_118;
  char local_10d;
  uint local_10c;
  CodedInputStream *local_108;
  char local_fd;
  uint local_fc;
  CodedInputStream *local_f8;
  char local_ed;
  uint local_ec;
  CodedInputStream *local_e8;
  char local_dd;
  undefined4 local_dc;
  CodedInputStream *local_d8;
  char local_cd;
  undefined4 local_cc;
  CodedInputStream *local_c8;
  char local_bd;
  undefined4 local_bc;
  CodedInputStream *local_b8;
  char local_ad;
  undefined4 local_ac;
  CodedInputStream *local_a8;
  char local_9d;
  FileOptions_OptimizeMode local_9c;
  FileOptions_OptimizeMode *pFStack_98;
  uint32 temp;
  CodedInputStream *local_90;
  undefined1 local_85;
  uint32 local_84;
  bool *pbStack_80;
  uint32 temp_5;
  CodedInputStream *local_78;
  undefined1 local_6d;
  uint32 local_6c;
  bool *pbStack_68;
  uint32 temp_4;
  CodedInputStream *local_60;
  undefined1 local_55;
  uint32 local_54;
  bool *pbStack_50;
  uint32 temp_3;
  CodedInputStream *local_48;
  undefined1 local_3d;
  uint32 local_3c;
  bool *pbStack_38;
  uint32 temp_2;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  bool *pbStack_20;
  uint32 temp_1;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  _value = input;
  input_local = (CodedInputStream *)this;
  do {
    while( true ) {
      pCVar1 = _value;
      local_148 = _value;
      if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ < 0x80)) {
        _value->last_tag_ = (uint)*_value->buffer_;
        io::CodedInputStream::Advance(_value,1);
        local_140 = pCVar1->last_tag_;
      }
      else {
        uVar3 = io::CodedInputStream::ReadTagFallback(_value);
        pCVar1->last_tag_ = uVar3;
        local_140 = pCVar1->last_tag_;
      }
      local_164 = local_140;
      if (local_140 == 0) {
        return true;
      }
      iVar4 = internal::WireFormatLite::GetTagFieldNumber(local_140);
      if (iVar4 == 1) break;
      if (iVar4 == 8) {
        WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
        if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002fe442;
      }
      else {
        if (iVar4 == 9) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_002ff364;
          goto LAB_002fe600;
        }
        if (iVar4 == 10) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_002ff364;
          goto LAB_002fe7e5;
        }
        if (iVar4 == 0xb) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 != WIRETYPE_LENGTH_DELIMITED) goto LAB_002ff364;
          goto LAB_002fe98a;
        }
        if (iVar4 == 0x10) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_002ff364;
          goto LAB_002feb44;
        }
        if (iVar4 == 0x11) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_002ff364;
          goto LAB_002fece9;
        }
        if (iVar4 == 0x12) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_002ff364;
          goto LAB_002fee8e;
        }
        if (iVar4 == 0x14) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
          if (WVar5 == WIRETYPE_VARINT) goto LAB_002ff033;
        }
        else if ((iVar4 == 999) &&
                (WVar5 = internal::WireFormatLite::GetTagWireType(local_164),
                WVar5 == WIRETYPE_LENGTH_DELIMITED)) goto LAB_002ff1d8;
      }
LAB_002ff364:
      WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
      pCVar1 = _value;
      uVar3 = local_164;
      containing_type = default_instance_;
      if (WVar5 == WIRETYPE_END_GROUP) {
        return true;
      }
      if (local_164 < 8000) {
        pUVar8 = mutable_unknown_fields(this);
        bVar2 = internal::WireFormat::SkipField(pCVar1,uVar3,pUVar8);
        if (!bVar2) {
          return false;
        }
      }
      else {
        pUVar8 = mutable_unknown_fields(this);
        bVar2 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,uVar3,pCVar1,containing_type,pUVar8);
        if (!bVar2) {
          return false;
        }
      }
    }
    WVar5 = internal::WireFormatLite::GetTagWireType(local_164);
    pCVar1 = _value;
    if (WVar5 != WIRETYPE_LENGTH_DELIMITED) goto LAB_002ff364;
    psVar6 = mutable_java_package_abi_cxx11_(this);
    bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
    if (!bVar2) {
      return false;
    }
    java_package_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    java_package_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
    local_a8 = _value;
    local_ac = 0x42;
    if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'B')) {
      io::CodedInputStream::Advance(_value,1);
      local_9d = '\x01';
    }
    else {
      local_9d = '\0';
    }
    if (local_9d != '\0') {
LAB_002fe442:
      pCVar1 = _value;
      psVar6 = mutable_java_outer_classname_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
      if (!bVar2) {
        return false;
      }
      java_outer_classname_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      java_outer_classname_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
      local_b8 = _value;
      local_bc = 0x48;
      if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'H')) {
        io::CodedInputStream::Advance(_value,1);
        local_ad = '\x01';
      }
      else {
        local_ad = '\0';
      }
      if (local_ad != '\0') {
LAB_002fe600:
        local_90 = _value;
        pFStack_98 = &local_168;
        local_85 = io::CodedInputStream::ReadVarint32(_value,&local_9c);
        if (!(bool)local_85) {
          return false;
        }
        *pFStack_98 = local_9c;
        bVar2 = FileOptions_OptimizeMode_IsValid(local_168);
        if (bVar2) {
          set_optimize_for(this,local_168);
        }
        else {
          pUVar8 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar8,9,(long)(int)local_168);
        }
        local_c8 = _value;
        local_cc = 0x50;
        if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'P')) {
          io::CodedInputStream::Advance(_value,1);
          local_bd = '\x01';
        }
        else {
          local_bd = '\0';
        }
        if (local_bd != '\0') {
LAB_002fe7e5:
          pbStack_20 = &this->java_multiple_files_;
          local_18 = _value;
          local_9 = io::CodedInputStream::ReadVarint32(_value,&local_24);
          if (!(bool)local_9) {
            return false;
          }
          *pbStack_20 = local_24 != 0;
          set_has_java_multiple_files(this);
          local_d8 = _value;
          local_dc = 0x5a;
          if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'Z')) {
            io::CodedInputStream::Advance(_value,1);
            local_cd = '\x01';
          }
          else {
            local_cd = '\0';
          }
          if (local_cd != '\0') {
LAB_002fe98a:
            pCVar1 = _value;
            psVar6 = mutable_go_package_abi_cxx11_(this);
            bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
            if (!bVar2) {
              return false;
            }
            go_package_abi_cxx11_(this);
            pcVar7 = (char *)std::__cxx11::string::data();
            go_package_abi_cxx11_(this);
            iVar4 = std::__cxx11::string::length();
            internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
            pCVar1 = _value;
            local_e8 = _value;
            local_ec = 0x80;
            iVar4 = io::CodedInputStream::BufferSize(_value);
            if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_ec & 0xff | 0x80))) ||
               ((uint)pCVar1->buffer_[1] != (local_ec >> 7 & 0xff))) {
              local_dd = '\0';
            }
            else {
              io::CodedInputStream::Advance(pCVar1,2);
              local_dd = '\x01';
            }
            if (local_dd != '\0') {
LAB_002feb44:
              pbStack_38 = &this->cc_generic_services_;
              local_30 = _value;
              local_25 = io::CodedInputStream::ReadVarint32(_value,&local_3c);
              if (!(bool)local_25) {
                return false;
              }
              *pbStack_38 = local_3c != 0;
              set_has_cc_generic_services(this);
              pCVar1 = _value;
              local_f8 = _value;
              local_fc = 0x88;
              iVar4 = io::CodedInputStream::BufferSize(_value);
              if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_fc & 0xff | 0x80))) ||
                 ((uint)pCVar1->buffer_[1] != (local_fc >> 7 & 0xff))) {
                local_ed = '\0';
              }
              else {
                io::CodedInputStream::Advance(pCVar1,2);
                local_ed = '\x01';
              }
              if (local_ed != '\0') {
LAB_002fece9:
                pbStack_50 = &this->java_generic_services_;
                local_48 = _value;
                local_3d = io::CodedInputStream::ReadVarint32(_value,&local_54);
                if (!(bool)local_3d) {
                  return false;
                }
                *pbStack_50 = local_54 != 0;
                set_has_java_generic_services(this);
                pCVar1 = _value;
                local_108 = _value;
                local_10c = 0x90;
                iVar4 = io::CodedInputStream::BufferSize(_value);
                if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_10c & 0xff | 0x80))) ||
                   ((uint)pCVar1->buffer_[1] != (local_10c >> 7 & 0xff))) {
                  local_fd = '\0';
                }
                else {
                  io::CodedInputStream::Advance(pCVar1,2);
                  local_fd = '\x01';
                }
                if (local_fd != '\0') {
LAB_002fee8e:
                  pbStack_68 = &this->py_generic_services_;
                  local_60 = _value;
                  local_55 = io::CodedInputStream::ReadVarint32(_value,&local_6c);
                  if (!(bool)local_55) {
                    return false;
                  }
                  *pbStack_68 = local_6c != 0;
                  set_has_py_generic_services(this);
                  pCVar1 = _value;
                  local_118 = _value;
                  local_11c = 0xa0;
                  iVar4 = io::CodedInputStream::BufferSize(_value);
                  if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_11c & 0xff | 0x80))) ||
                     ((uint)pCVar1->buffer_[1] != (local_11c >> 7 & 0xff))) {
                    local_10d = '\0';
                  }
                  else {
                    io::CodedInputStream::Advance(pCVar1,2);
                    local_10d = '\x01';
                  }
                  if (local_10d != '\0') {
LAB_002ff033:
                    pbStack_80 = &this->java_generate_equals_and_hash_;
                    local_78 = _value;
                    local_6d = io::CodedInputStream::ReadVarint32(_value,&local_84);
                    if (!(bool)local_6d) {
                      return false;
                    }
                    *pbStack_80 = local_84 != 0;
                    set_has_java_generate_equals_and_hash(this);
                    pCVar1 = _value;
                    local_128 = _value;
                    local_12c = 0x1f3a;
                    iVar4 = io::CodedInputStream::BufferSize(_value);
                    if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_12c & 0xff | 0x80))) ||
                       ((uint)pCVar1->buffer_[1] != (local_12c >> 7 & 0xff))) {
                      local_11d = '\0';
                    }
                    else {
                      io::CodedInputStream::Advance(pCVar1,2);
                      local_11d = '\x01';
                    }
                    if (local_11d != '\0') {
LAB_002ff1d8:
                      do {
                        pCVar1 = _value;
                        value_00 = add_uninterpreted_option(this);
                        bVar2 = internal::WireFormatLite::
                                ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                                          (pCVar1,value_00);
                        pCVar1 = _value;
                        if (!bVar2) {
                          return false;
                        }
                        local_138 = _value;
                        local_13c = 0x1f3a;
                        iVar4 = io::CodedInputStream::BufferSize(_value);
                        if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_13c & 0xff | 0x80)))
                           || ((uint)pCVar1->buffer_[1] != (local_13c >> 7 & 0xff))) {
                          local_12d = '\0';
                        }
                        else {
                          io::CodedInputStream::Advance(pCVar1,2);
                          local_12d = '\x01';
                        }
                      } while (local_12d != '\0');
                      bVar2 = io::CodedInputStream::ExpectAtEnd(_value);
                      if (bVar2) {
                        return true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_java_outer_classname;
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_java_outer_classname:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(72)) goto parse_optimize_for;
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_optimize_for:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_java_multiple_files;
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_multiple_files:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
          set_has_java_multiple_files();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(90)) goto parse_go_package;
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_go_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(128)) goto parse_cc_generic_services;
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_cc_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
          set_has_cc_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(136)) goto parse_java_generic_services;
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
          set_has_java_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(144)) goto parse_py_generic_services;
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_py_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
          set_has_py_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(160)) goto parse_java_generate_equals_and_hash;
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [default = false];
      case 20: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generate_equals_and_hash:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
          set_has_java_generate_equals_and_hash();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}